

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  uint uVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char **__dest;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  iVar7 = (this->History).Size;
  uVar8 = (ulong)iVar7;
  iVar7 = iVar7 + 1;
  do {
    if ((long)uVar8 < 1) goto LAB_00148392;
    if ((long)(this->History).Size < (long)uVar8) goto LAB_0014853d;
    iVar3 = Stricmp((this->History).Data[uVar8 - 1],command_line);
    iVar7 = iVar7 + -1;
    uVar8 = uVar8 - 1;
  } while (iVar3 != 0);
  if ((this->History).Size < iVar7) {
LAB_0014853d:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                  ,0x52e,"T &ImVector<char *>::operator[](int) [T = char *]");
  }
  free((this->History).Data[uVar8]);
  iVar3 = (this->History).Size;
  if (iVar3 < iVar7) {
    __assert_fail("it >= Data && it < Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                  ,0x546,"T *ImVector<char *>::erase(const T *) [T = char *]");
  }
  ppcVar2 = (this->History).Data;
  uVar8 = uVar8 & 0xffffffff;
  memmove(ppcVar2 + uVar8,ppcVar2 + uVar8 + 1,((long)iVar3 + ~uVar8) * 8);
  (this->History).Size = (this->History).Size + -1;
LAB_00148392:
  pcVar5 = Strdup(command_line);
  iVar7 = (this->History).Size;
  iVar3 = (this->History).Capacity;
  if (iVar7 == iVar3) {
    iVar7 = iVar7 + 1;
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar3 < iVar7) {
      __dest = (char **)ImGui::MemAlloc((long)iVar7 << 3);
      ppcVar2 = (this->History).Data;
      if (ppcVar2 != (char **)0x0) {
        memcpy(__dest,ppcVar2,(long)(this->History).Size << 3);
        ImGui::MemFree((this->History).Data);
      }
      (this->History).Data = __dest;
      (this->History).Capacity = iVar7;
    }
  }
  (this->History).Data[(this->History).Size] = pcVar5;
  (this->History).Size = (this->History).Size + 1;
  iVar7 = Stricmp(command_line,"CLEAR");
  if (iVar7 == 0) {
    ClearLog(this);
  }
  else {
    iVar7 = Stricmp(command_line,"HELP");
    if (iVar7 == 0) {
      AddLog(this,"Commands:");
      if (0 < (this->Commands).Size) {
        lVar9 = 0;
        do {
          AddLog(this,"- %s",(this->Commands).Data[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->Commands).Size);
      }
    }
    else {
      iVar7 = Stricmp(command_line,"HISTORY");
      if (iVar7 == 0) {
        uVar1 = (this->History).Size;
        uVar4 = 10;
        if (10 < (int)uVar1) {
          uVar4 = uVar1;
        }
        if ((int)(uVar4 - 10) < (int)uVar1) {
          uVar8 = (ulong)uVar4 - 10;
          do {
            AddLog(this,"%3d: %s\n",uVar8 & 0xffffffff,(this->History).Data[uVar8]);
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)(this->History).Size);
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size-1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }